

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrEva.c
# Opt level: O0

void Rwr_ScoresReport(Rwr_Man_t *p)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint local_3a8;
  uint local_3a4;
  uint uTruth;
  int k;
  int iNew;
  int i;
  Rwr_Node_t *pNode;
  Vec_Ptr_t *vSubgraphs;
  int Perm [222];
  Rwr_Man_t *p_local;
  
  Perm._880_8_ = p;
  if (p->vClasses->nSize == 0xde) {
    for (k = 0; k < *(int *)(*(long *)(Perm._880_8_ + 0x50) + 4); k = k + 1) {
      Perm[(long)k + -2] = k;
      Gains[k] = 0;
      pNode = (Rwr_Node_t *)Vec_VecEntry(*(Vec_Vec_t **)(Perm._880_8_ + 0x50),k);
      for (local_3a4 = 0; uVar1 = local_3a4, iVar2 = Vec_PtrSize((Vec_Ptr_t *)pNode),
          (int)uVar1 < iVar2; local_3a4 = local_3a4 + 1) {
        _iNew = Vec_PtrEntry((Vec_Ptr_t *)pNode,local_3a4);
        Gains[k] = (int)*(short *)((long)_iNew + 10) + Gains[k];
      }
    }
    qsort(&vSubgraphs,0xde,4,Rwr_ScoresCompare);
    k = 0;
    while ((k < *(int *)(*(long *)(Perm._880_8_ + 0x50) + 4) &&
           (uTruth = Perm[(long)k + -2], Gains[(int)uTruth] != 0))) {
      pNode = (Rwr_Node_t *)Vec_VecEntry(*(Vec_Vec_t **)(Perm._880_8_ + 0x50),uTruth);
      uVar1 = uTruth;
      uVar3 = Vec_PtrSize((Vec_Ptr_t *)pNode);
      printf("CLASS %3d: Subgr = %3d. Total gain = %6d.  ",(ulong)uVar1,(ulong)uVar3,
             (ulong)(uint)Gains[(int)uTruth]);
      local_3a8 = (uint)*(ushort *)(*(long *)(Perm._880_8_ + 0x28) + (long)(int)uTruth * 2);
      Extra_PrintBinary(_stdout,&local_3a8,0x10);
      printf("  ");
      Ivy_TruthDsdComputePrint
                (CONCAT22(*(undefined2 *)(*(long *)(Perm._880_8_ + 0x28) + (long)(int)uTruth * 2),
                          *(undefined2 *)(*(long *)(Perm._880_8_ + 0x28) + (long)(int)uTruth * 2)));
      for (local_3a4 = 0; uVar1 = local_3a4, iVar2 = Vec_PtrSize((Vec_Ptr_t *)pNode),
          (int)uVar1 < iVar2; local_3a4 = local_3a4 + 1) {
        _iNew = Vec_PtrEntry((Vec_Ptr_t *)pNode,local_3a4);
        if (*(short *)((long)_iNew + 8) != 0) {
          printf("    %2d: S=%5d. A=%5d. G=%6d. ",(ulong)local_3a4,
                 (ulong)(uint)(int)*(short *)((long)_iNew + 8),
                 (ulong)(uint)(int)*(short *)((long)_iNew + 0xc),
                 (ulong)(uint)(int)*(short *)((long)_iNew + 10));
          Dec_GraphPrint(_stdout,*(Dec_Graph_t **)((long)_iNew + 0x28),(char **)0x0,(char *)0x0);
        }
      }
      k = k + 1;
    }
    return;
  }
  __assert_fail("p->vClasses->nSize == 222",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/rwr/rwrEva.c"
                ,0x22f,"void Rwr_ScoresReport(Rwr_Man_t *)");
}

Assistant:

void Rwr_ScoresReport( Rwr_Man_t * p )
{
    extern void Ivy_TruthDsdComputePrint( unsigned uTruth );
    int Perm[222];
    Vec_Ptr_t * vSubgraphs;
    Rwr_Node_t * pNode;
    int i, iNew, k;
    unsigned uTruth;
    // collect total gains
    assert( p->vClasses->nSize == 222 );
    for ( i = 0; i < p->vClasses->nSize; i++ )
    {
        Perm[i] = i;
        Gains[i] = 0;
        vSubgraphs = Vec_VecEntry( p->vClasses, i );
        Vec_PtrForEachEntry( Rwr_Node_t *, vSubgraphs, pNode, k )
            Gains[i] += pNode->nGain;
    }
    // sort the gains
    qsort( Perm, 222, sizeof(int), (int (*)(const void *, const void *))Rwr_ScoresCompare );

    // print classes
    for ( i = 0; i < p->vClasses->nSize; i++ )
    {
        iNew = Perm[i];
        if ( Gains[iNew] == 0 )
            break;
        vSubgraphs = Vec_VecEntry( p->vClasses, iNew );
        printf( "CLASS %3d: Subgr = %3d. Total gain = %6d.  ", iNew, Vec_PtrSize(vSubgraphs), Gains[iNew] );
        uTruth = (unsigned)p->pMapInv[iNew];
        Extra_PrintBinary( stdout, &uTruth, 16 );
        printf( "  " );
        Ivy_TruthDsdComputePrint( (unsigned)p->pMapInv[iNew] | ((unsigned)p->pMapInv[iNew] << 16) );
        Vec_PtrForEachEntry( Rwr_Node_t *, vSubgraphs, pNode, k )
        {
            if ( pNode->nScore == 0 )
                continue;
            printf( "    %2d: S=%5d. A=%5d. G=%6d. ", k, pNode->nScore, pNode->nAdded, pNode->nGain );
            Dec_GraphPrint( stdout, (Dec_Graph_t *)pNode->pNext, NULL, NULL );
        }
    }
}